

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::QueryGeometrySeparate::checkTransformFeedbackBuffer
          (QueryGeometrySeparate *this)

{
  GLenum in_EDX;
  BindBufferCase in_ESI;
  
  checkTransformFeedbackBuffer
            ((QueryGeometrySeparate *)
             ((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                     _vptr_CaptureGeometryInterleaved +
             (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                   _vptr_CaptureGeometryInterleaved[-0xc]),in_ESI,in_EDX);
  return;
}

Assistant:

bool gl3cts::TransformFeedback::QueryGeometrySeparate::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint number_of_primitives;

	gl.getQueryObjectuiv(m_query_object, GL_QUERY_RESULT, &number_of_primitives);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv call failed.");

	/* expected result */
	glw::GLuint number_of_primitives_reference = (primitive_type == GL_POINTS) ? 3 : 1; /* m_max_vertices_drawn == 3 */

	if (number_of_primitives_reference != number_of_primitives)
	{
		return false;
	}

	return true;
}